

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

int tinyformat::detail::convertToInt<const_char_*,_false>::invoke(char **param_1)

{
  runtime_error *this;
  long in_FS_OFFSET;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "tinyformat: Cannot convert from argument type to integer for use as variable width or precision"
             ,"");
  std::runtime_error::runtime_error(this,(string *)local_48);
  *(undefined ***)this = &PTR__runtime_error_01388e60;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __stack_chk_fail();
}

Assistant:

static int invoke(const T& /*value*/)
    {
        TINYFORMAT_ERROR("tinyformat: Cannot convert from argument type to "
                         "integer for use as variable width or precision");
        return 0;
    }